

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDual.cpp
# Opt level: O0

void __thiscall HEkkDual::iterate(HEkkDual *this)

{
  bool bVar1;
  HVector *in_RDI;
  HEkkDual *unaff_retaddr;
  HEkkDual *in_stack_00000010;
  HighsInt to_check_iter;
  HighsInt from_check_iter;
  HEkkDual *in_stack_00000030;
  HEkkDual *in_stack_00000060;
  HVector *in_stack_00000088;
  HEkkDual *in_stack_00000090;
  HVector *in_stack_00000138;
  HEkkDual *in_stack_00000140;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe7;
  undefined4 uVar2;
  undefined4 uVar3;
  
  uVar3 = 0;
  uVar2 = 100;
  if ((*(byte *)((in_RDI->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish + 0xe1c) & 1) != 0) {
    in_stack_ffffffffffffffe7 = false;
    if (-1 < (in_RDI->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish[0xdbe]) {
      in_stack_ffffffffffffffe7 =
           (in_RDI->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish[0xdbe] < 0x65;
    }
    *(undefined1 *)
     ((long)(in_RDI->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish + 0x3871) = in_stack_ffffffffffffffe7;
    if ((*(byte *)((long)(in_RDI->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish + 0x3871) & 1) != 0) {
      printf("HEkkDual::iterate Debug iteration %d\n",
             (ulong)(uint)(in_RDI->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish[0xdbe]);
    }
  }
  HighsSimplexAnalysis::simplexTimerStart
            ((HighsSimplexAnalysis *)CONCAT44(uVar3,uVar2),(HighsInt)((ulong)in_RDI >> 0x20),
             (HighsInt)in_RDI);
  chooseRow(in_stack_00000060);
  HighsSimplexAnalysis::simplexTimerStop
            ((HighsSimplexAnalysis *)CONCAT44(uVar3,uVar2),(HighsInt)((ulong)in_RDI >> 0x20),
             (HighsInt)in_RDI);
  HighsSimplexAnalysis::simplexTimerStart
            ((HighsSimplexAnalysis *)CONCAT44(uVar3,uVar2),(HighsInt)((ulong)in_RDI >> 0x20),
             (HighsInt)in_RDI);
  chooseColumn(in_stack_00000140,in_stack_00000138);
  HighsSimplexAnalysis::simplexTimerStop
            ((HighsSimplexAnalysis *)CONCAT44(uVar3,uVar2),(HighsInt)((ulong)in_RDI >> 0x20),
             (HighsInt)in_RDI);
  bVar1 = isBadBasisChange((HEkkDual *)0x78767d);
  if (!bVar1) {
    HighsSimplexAnalysis::simplexTimerStart
              ((HighsSimplexAnalysis *)CONCAT44(uVar3,uVar2),(HighsInt)((ulong)in_RDI >> 0x20),
               (HighsInt)in_RDI);
    updateFtranBFRT((HEkkDual *)CONCAT44(uVar3,uVar2));
    updateFtran((HEkkDual *)CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0));
    if (*(int *)((long)&(in_RDI->packValue).super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage + 4) == 2) {
      updateFtranDSE((HEkkDual *)CONCAT44(uVar3,uVar2),in_RDI);
    }
    HighsSimplexAnalysis::simplexTimerStop
              ((HighsSimplexAnalysis *)CONCAT44(uVar3,uVar2),(HighsInt)((ulong)in_RDI >> 0x20),
               (HighsInt)in_RDI);
    HighsSimplexAnalysis::simplexTimerStart
              ((HighsSimplexAnalysis *)CONCAT44(uVar3,uVar2),(HighsInt)((ulong)in_RDI >> 0x20),
               (HighsInt)in_RDI);
    updateVerify(in_stack_00000030);
    HighsSimplexAnalysis::simplexTimerStop
              ((HighsSimplexAnalysis *)CONCAT44(uVar3,uVar2),(HighsInt)((ulong)in_RDI >> 0x20),
               (HighsInt)in_RDI);
    HighsSimplexAnalysis::simplexTimerStart
              ((HighsSimplexAnalysis *)CONCAT44(uVar3,uVar2),(HighsInt)((ulong)in_RDI >> 0x20),
               (HighsInt)in_RDI);
    updateDual(in_stack_00000010);
    HighsSimplexAnalysis::simplexTimerStop
              ((HighsSimplexAnalysis *)CONCAT44(uVar3,uVar2),(HighsInt)((ulong)in_RDI >> 0x20),
               (HighsInt)in_RDI);
    HighsSimplexAnalysis::simplexTimerStart
              ((HighsSimplexAnalysis *)CONCAT44(uVar3,uVar2),(HighsInt)((ulong)in_RDI >> 0x20),
               (HighsInt)in_RDI);
    updatePrimal(in_stack_00000090,in_stack_00000088);
    HighsSimplexAnalysis::simplexTimerStop
              ((HighsSimplexAnalysis *)CONCAT44(uVar3,uVar2),(HighsInt)((ulong)in_RDI >> 0x20),
               (HighsInt)in_RDI);
    *(undefined1 *)
     ((in_RDI->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish + 0x957) = 0;
    HighsSimplexAnalysis::simplexTimerStart
              ((HighsSimplexAnalysis *)CONCAT44(uVar3,uVar2),(HighsInt)((ulong)in_RDI >> 0x20),
               (HighsInt)in_RDI);
    updatePivots((HEkkDual *)CONCAT44(uVar3,uVar2));
    HighsSimplexAnalysis::simplexTimerStop
              ((HighsSimplexAnalysis *)CONCAT44(uVar3,uVar2),(HighsInt)((ulong)in_RDI >> 0x20),
               (HighsInt)in_RDI);
    if (((ulong)(in_RDI->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start & 1) != 0) {
      HighsSimplexAnalysis::simplexTimerStart
                ((HighsSimplexAnalysis *)CONCAT44(uVar3,uVar2),(HighsInt)((ulong)in_RDI >> 0x20),
                 (HighsInt)in_RDI);
      initialiseDevexFramework(unaff_retaddr);
      HighsSimplexAnalysis::simplexTimerStop
                ((HighsSimplexAnalysis *)CONCAT44(uVar3,uVar2),(HighsInt)((ulong)in_RDI >> 0x20),
                 (HighsInt)in_RDI);
    }
    iterationAnalysis((HEkkDual *)CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0));
  }
  return;
}

Assistant:

void HEkkDual::iterate() {
  // This is the main iteration loop for dual revised simplex. All the
  // methods have as their first line if (rebuild_reason) return;, where
  // rebuild_reason is, for example, set to 1 when CHUZR finds no
  // candidate. This causes a break from the inner loop of
  // solvePhase% and, hence, a call to rebuild()

  // Reporting:
  // Row-wise matrix after update in updateMatrix(variable_in, variable_out);

  const HighsInt from_check_iter = 0;
  const HighsInt to_check_iter = from_check_iter + 100;
  if (ekk_instance_.debug_solve_report_) {
    ekk_instance_.debug_iteration_report_ =
        ekk_instance_.iteration_count_ >= from_check_iter &&
        ekk_instance_.iteration_count_ <= to_check_iter;
    if (ekk_instance_.debug_iteration_report_) {
      printf("HEkkDual::iterate Debug iteration %d\n",
             (int)ekk_instance_.iteration_count_);
    }
  }

  analysis->simplexTimerStart(IterateChuzrClock);
  chooseRow();
  analysis->simplexTimerStop(IterateChuzrClock);

  analysis->simplexTimerStart(IterateChuzcClock);
  chooseColumn(&row_ep);
  analysis->simplexTimerStop(IterateChuzcClock);

  if (isBadBasisChange()) return;

  analysis->simplexTimerStart(IterateFtranClock);
  updateFtranBFRT();

  // updateFtran(); computes the pivotal column in the data structure "column"
  updateFtran();

  // updateFtranDSE performs the DSE FTRAN on pi_p
  if (edge_weight_mode == EdgeWeightMode::kSteepestEdge)
    updateFtranDSE(&row_ep);
  analysis->simplexTimerStop(IterateFtranClock);

  // updateVerify() Checks row-wise pivot against column-wise pivot for
  // numerical trouble
  analysis->simplexTimerStart(IterateVerifyClock);
  updateVerify();
  analysis->simplexTimerStop(IterateVerifyClock);

  // updateDual() Updates the dual values
  analysis->simplexTimerStart(IterateDualClock);
  updateDual();
  analysis->simplexTimerStop(IterateDualClock);

  //  debugUpdatedObjectiveValue(ekk_instance_, algorithm, solve_phase, "Before
  //  updatePrimal");
  // updatePrimal(&row_ep); Updates the primal values and the edge weights
  analysis->simplexTimerStart(IteratePrimalClock);
  updatePrimal(&row_ep);
  analysis->simplexTimerStop(IteratePrimalClock);
  // After primal update in dual simplex the primal objective value is not known
  ekk_instance_.status_.has_primal_objective_value = false;
  //  debugUpdatedObjectiveValue(ekk_instance_, algorithm, solve_phase, "After
  //  updatePrimal");

  // Update the records of chosen rows and pivots
  //  ekk_instance_.info_.pivot_.push_back(alpha_row);
  //  ekk_instance_.info_.index_chosen_.push_back(row_out);

  // Update the basis representation
  analysis->simplexTimerStart(IteratePivotsClock);
  updatePivots();
  analysis->simplexTimerStop(IteratePivotsClock);

  if (new_devex_framework) {
    // Initialise new Devex framework
    analysis->simplexTimerStart(IterateDevexIzClock);
    initialiseDevexFramework();
    analysis->simplexTimerStop(IterateDevexIzClock);
  }

  // Analyse the iteration: possibly report; possibly switch strategy
  iterationAnalysis();
}